

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_ni.c
# Opt level: O1

void libyang_verbclb(LY_LOG_LEVEL level,char *msg,char *path)

{
  char *pcVar1;
  
  if (verbose < level) {
    return;
  }
  if (level < LY_LLDBG) {
    pcVar1 = &DAT_0010d17c + *(int *)(&DAT_0010d17c + (ulong)level * 4);
  }
  else {
    pcVar1 = "dbg :";
  }
  if (path == (char *)0x0) {
    fprintf(_stderr,"%s %s\n",pcVar1,msg);
    return;
  }
  fprintf(_stderr,"%s %s (%s)\n",pcVar1,msg);
  return;
}

Assistant:

void
libyang_verbclb(LY_LOG_LEVEL level, const char *msg, const char *path)
{
    char *levstr;

    if (level <= verbose) {
        switch(level) {
        case LY_LLERR:
            levstr = "err :";
            break;
        case LY_LLWRN:
            levstr = "warn:";
            break;
        case LY_LLVRB:
            levstr = "verb:";
            break;
        default:
            levstr = "dbg :";
            break;
        }
        if (path) {
            fprintf(stderr, "%s %s (%s)\n", levstr, msg, path);
        } else {
            fprintf(stderr, "%s %s\n", levstr, msg);
        }
    }
}